

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdgroupsimple.h
# Opt level: O3

void FastPForLib::SIMDGroupSimple<false,_false>::encodeArrayInternal_woRingBuf
               (uint32_t *in,size_t len,uint32_t *out,size_t *nvalue)

{
  byte *pbVar1;
  byte *pbVar2;
  byte bVar3;
  undefined1 auVar4 [16];
  byte bVar5;
  bool bVar6;
  int iVar7;
  void *pvVar8;
  bool bVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  byte *pbVar13;
  uint32_t *puVar14;
  int iVar15;
  uint uVar16;
  uint32_t *puVar17;
  byte bVar18;
  long lVar19;
  long in_R10;
  long in_R11;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  undefined1 auVar24 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  __m128i alVar40;
  uint8_t local_81;
  long local_80;
  uint32_t *local_78;
  size_t local_70;
  __m128i *local_68;
  uint32_t *local_60;
  __m128i *local_58;
  __m128i *local_50;
  ulong local_48;
  long local_40;
  ulong *local_38;
  undefined1 auVar25 [32];
  undefined1 auVar23 [32];
  
  uVar20 = len >> 2 & 0xfffffffffffffff;
  local_38 = nvalue;
  pvVar8 = operator_new__(uVar20 * 4);
  if (len != 0) {
    auVar28 = vpmovsxbq_avx512f(ZEXT816(0x3c3834302c282420));
    auVar29 = vpmovsxbq_avx512f(ZEXT816(0x1c1814100c080400));
    auVar30 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar31 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar32 = vpbroadcastq_avx512f(ZEXT816(2));
    auVar33 = vpbroadcastq_avx512f(ZEXT816(1));
    auVar34 = vpbroadcastq_avx512f(ZEXT816(3));
    auVar35 = vpbroadcastq_avx512f(ZEXT816(0x40));
    uVar11 = 0;
    auVar36 = vpbroadcastq_avx512f();
    auVar36 = vpsrlq_avx512f(auVar36,2);
    uVar10 = (len - 1 >> 2) + 0x10 & 0xfffffffffffffff0;
    do {
      auVar37 = vpbroadcastq_avx512f();
      vporq_avx512f(auVar28,auVar33);
      vporq_avx512f(auVar29,auVar33);
      auVar38 = vporq_avx512f(auVar37,auVar30);
      auVar37 = vporq_avx512f(auVar37,auVar31);
      uVar21 = vpcmpuq_avx512f(auVar38,auVar36,2);
      uVar22 = vpcmpuq_avx512f(auVar37,auVar36,2);
      auVar23 = vpgatherqd_avx512f(*(undefined8 *)(in + uVar10));
      bVar18 = (byte)uVar21;
      auVar24._4_4_ = (uint)((byte)(uVar21 >> 1) & 1) * auVar23._4_4_;
      auVar24._0_4_ = (uint)(bVar18 & 1) * auVar23._0_4_;
      auVar24._8_4_ = (uint)((byte)(uVar21 >> 2) & 1) * auVar23._8_4_;
      auVar24._12_4_ = (uint)((byte)(uVar21 >> 3) & 1) * auVar23._12_4_;
      auVar24._16_4_ = (uint)((byte)(uVar21 >> 4) & 1) * auVar23._16_4_;
      auVar24._20_4_ = (uint)((byte)(uVar21 >> 5) & 1) * auVar23._20_4_;
      auVar24._24_4_ = (uint)((byte)(uVar21 >> 6) & 1) * auVar23._24_4_;
      auVar24._28_4_ = (uint)(byte)(uVar21 >> 7) * auVar23._28_4_;
      auVar23 = vpgatherqd_avx512f(*(undefined8 *)(in + uVar11));
      bVar3 = (byte)uVar22;
      auVar25 = vpgatherqd_avx512f(*(undefined8 *)(in + in_R11));
      auVar26._4_4_ = (uint)((byte)(uVar21 >> 1) & 1) * auVar25._4_4_;
      auVar26._0_4_ = (uint)(bVar18 & 1) * auVar25._0_4_;
      auVar26._8_4_ = (uint)((byte)(uVar21 >> 2) & 1) * auVar25._8_4_;
      auVar26._12_4_ = (uint)((byte)(uVar21 >> 3) & 1) * auVar25._12_4_;
      auVar26._16_4_ = (uint)((byte)(uVar21 >> 4) & 1) * auVar25._16_4_;
      auVar26._20_4_ = (uint)((byte)(uVar21 >> 5) & 1) * auVar25._20_4_;
      auVar26._24_4_ = (uint)((byte)(uVar21 >> 6) & 1) * auVar25._24_4_;
      auVar26._28_4_ = (uint)(byte)(uVar21 >> 7) * auVar25._28_4_;
      auVar25 = vpgatherqd_avx512f(*(undefined8 *)(in + len));
      auVar37 = vinserti64x4_avx512f
                          (ZEXT3264(CONCAT428((uint)(byte)(uVar22 >> 7) * auVar23._28_4_,
                                              CONCAT424((uint)((byte)(uVar22 >> 6) & 1) *
                                                        auVar23._24_4_,
                                                        CONCAT420((uint)((byte)(uVar22 >> 5) & 1) *
                                                                  auVar23._20_4_,
                                                                  CONCAT416((uint)((byte)(uVar22 >>
                                                                                         4) & 1) *
                                                                            auVar23._16_4_,
                                                                            CONCAT412((uint)((byte)(
                                                  uVar22 >> 3) & 1) * auVar23._12_4_,
                                                  CONCAT48((uint)((byte)(uVar22 >> 2) & 1) *
                                                           auVar23._8_4_,
                                                           CONCAT44((uint)((byte)(uVar22 >> 1) & 1)
                                                                    * auVar23._4_4_,
                                                                    (uint)(bVar3 & 1) *
                                                                    auVar23._0_4_)))))))),auVar24,1)
      ;
      auVar38 = vinserti64x4_avx512f
                          (ZEXT3264(CONCAT428((uint)(byte)(uVar22 >> 7) * auVar25._28_4_,
                                              CONCAT424((uint)((byte)(uVar22 >> 6) & 1) *
                                                        auVar25._24_4_,
                                                        CONCAT420((uint)((byte)(uVar22 >> 5) & 1) *
                                                                  auVar25._20_4_,
                                                                  CONCAT416((uint)((byte)(uVar22 >>
                                                                                         4) & 1) *
                                                                            auVar25._16_4_,
                                                                            CONCAT412((uint)((byte)(
                                                  uVar22 >> 3) & 1) * auVar25._12_4_,
                                                  CONCAT48((uint)((byte)(uVar22 >> 2) & 1) *
                                                           auVar25._8_4_,
                                                           CONCAT44((uint)((byte)(uVar22 >> 1) & 1)
                                                                    * auVar25._4_4_,
                                                                    (uint)(bVar3 & 1) *
                                                                    auVar25._0_4_)))))))),auVar26,1)
      ;
      vporq_avx512f(auVar28,auVar32);
      auVar23 = vpgatherqd_avx512f(*(undefined8 *)(in + in_R11));
      auVar25._4_4_ = (uint)((byte)(uVar21 >> 1) & 1) * auVar23._4_4_;
      auVar25._0_4_ = (uint)(bVar18 & 1) * auVar23._0_4_;
      auVar25._8_4_ = (uint)((byte)(uVar21 >> 2) & 1) * auVar23._8_4_;
      auVar25._12_4_ = (uint)((byte)(uVar21 >> 3) & 1) * auVar23._12_4_;
      auVar25._16_4_ = (uint)((byte)(uVar21 >> 4) & 1) * auVar23._16_4_;
      auVar25._20_4_ = (uint)((byte)(uVar21 >> 5) & 1) * auVar23._20_4_;
      auVar25._24_4_ = (uint)((byte)(uVar21 >> 6) & 1) * auVar23._24_4_;
      auVar25._28_4_ = (uint)(byte)(uVar21 >> 7) * auVar23._28_4_;
      auVar37 = vpord_avx512f(auVar38,auVar37);
      vporq_avx512f(auVar29,auVar32);
      auVar23 = vpgatherqd_avx512f(*(undefined8 *)(in + in_R10));
      auVar38 = vinserti64x4_avx512f
                          (ZEXT3264(CONCAT428((uint)(byte)(uVar22 >> 7) * auVar23._28_4_,
                                              CONCAT424((uint)((byte)(uVar22 >> 6) & 1) *
                                                        auVar23._24_4_,
                                                        CONCAT420((uint)((byte)(uVar22 >> 5) & 1) *
                                                                  auVar23._20_4_,
                                                                  CONCAT416((uint)((byte)(uVar22 >>
                                                                                         4) & 1) *
                                                                            auVar23._16_4_,
                                                                            CONCAT412((uint)((byte)(
                                                  uVar22 >> 3) & 1) * auVar23._12_4_,
                                                  CONCAT48((uint)((byte)(uVar22 >> 2) & 1) *
                                                           auVar23._8_4_,
                                                           CONCAT44((uint)((byte)(uVar22 >> 1) & 1)
                                                                    * auVar23._4_4_,
                                                                    (uint)(bVar3 & 1) *
                                                                    auVar23._0_4_)))))))),auVar25,1)
      ;
      vporq_avx512f(auVar28,auVar34);
      vporq_avx512f(auVar29,auVar34);
      auVar29 = vpaddq_avx512f(auVar29,auVar35);
      auVar28 = vpaddq_avx512f(auVar28,auVar35);
      auVar23 = vpgatherqd_avx512f(*(undefined8 *)((long)in * 5));
      auVar27._4_4_ = (uint)((byte)(uVar21 >> 1) & 1) * auVar23._4_4_;
      auVar27._0_4_ = (uint)(bVar18 & 1) * auVar23._0_4_;
      auVar27._8_4_ = (uint)((byte)(uVar21 >> 2) & 1) * auVar23._8_4_;
      auVar27._12_4_ = (uint)((byte)(uVar21 >> 3) & 1) * auVar23._12_4_;
      auVar27._16_4_ = (uint)((byte)(uVar21 >> 4) & 1) * auVar23._16_4_;
      auVar27._20_4_ = (uint)((byte)(uVar21 >> 5) & 1) * auVar23._20_4_;
      auVar27._24_4_ = (uint)((byte)(uVar21 >> 6) & 1) * auVar23._24_4_;
      auVar27._28_4_ = (uint)(byte)(uVar21 >> 7) * auVar23._28_4_;
      auVar23 = vpgatherqd_avx512f(*(undefined8 *)(in + in_R11));
      auVar39 = vinserti64x4_avx512f
                          (ZEXT3264(CONCAT428((uint)(byte)(uVar22 >> 7) * auVar23._28_4_,
                                              CONCAT424((uint)((byte)(uVar22 >> 6) & 1) *
                                                        auVar23._24_4_,
                                                        CONCAT420((uint)((byte)(uVar22 >> 5) & 1) *
                                                                  auVar23._20_4_,
                                                                  CONCAT416((uint)((byte)(uVar22 >>
                                                                                         4) & 1) *
                                                                            auVar23._16_4_,
                                                                            CONCAT412((uint)((byte)(
                                                  uVar22 >> 3) & 1) * auVar23._12_4_,
                                                  CONCAT48((uint)((byte)(uVar22 >> 2) & 1) *
                                                           auVar23._8_4_,
                                                           CONCAT44((uint)((byte)(uVar22 >> 1) & 1)
                                                                    * auVar23._4_4_,
                                                                    (uint)(bVar3 & 1) *
                                                                    auVar23._0_4_)))))))),auVar27,1)
      ;
      auVar37 = vpternlogd_avx512f(auVar39,auVar37,auVar38,0xfe);
      auVar37 = vmovdqu32_avx512f(auVar37);
      *(undefined1 (*) [64])((long)pvVar8 + uVar11 * 4) = auVar37;
      uVar11 = uVar11 + 0x10;
    } while (uVar10 != uVar11);
  }
  local_60 = out + 3;
  if (uVar20 == 0) {
    bVar9 = false;
    uVar10 = 0;
    puVar14 = local_60;
  }
  else {
    lVar12 = 0;
    puVar17 = local_60;
    bVar6 = true;
    do {
      bVar9 = bVar6;
      lVar19 = 0;
      do {
        uVar10 = (ulong)(byte)(&SIMDGroupSimple<false,false>::tableNum)[lVar19];
        if (uVar20 < (byte)(&SIMDGroupSimple<false,false>::tableNum)[lVar19]) {
          uVar10 = uVar20;
        }
        uVar11 = uVar10 + (uVar10 == 0);
        uVar21 = 0;
        do {
          uVar22 = uVar21;
          if ((uint)(&SIMDGroupSimple<false,false>::tableMask)[lVar19] <
              *(uint *)((long)pvVar8 + uVar21 * 4 + lVar12 * 4)) break;
          uVar21 = uVar21 + 1;
          uVar22 = uVar11;
        } while (uVar11 != uVar21);
        if (uVar22 == uVar10) goto LAB_0012e95e;
        lVar19 = lVar19 + 1;
      } while (lVar19 != 10);
      lVar19 = 10;
      uVar10 = uVar22;
LAB_0012e95e:
      bVar18 = (byte)lVar19;
      puVar14 = puVar17;
      if (!bVar9) {
        bVar18 = bVar18 << 4 | (byte)*puVar17;
        puVar14 = (uint32_t *)((long)puVar17 + 1);
      }
      *(byte *)puVar17 = bVar18;
      uVar20 = uVar20 - uVar10;
      lVar12 = lVar12 + uVar10;
      puVar17 = puVar14;
      bVar6 = (bool)(bVar9 ^ 1);
    } while (uVar20 != 0);
  }
  uVar11 = (ulong)bVar9;
  pbVar2 = (byte *)((long)puVar14 + uVar11);
  bVar18 = (byte)uVar10;
  *(byte *)((long)puVar14 + uVar11) = bVar18;
  local_78 = out;
  local_70 = len;
  operator_delete__(pvVar8);
  local_40 = (long)pbVar2 - (long)local_60;
  uVar20 = (ulong)((uint)(local_40 + 0xd) & 0xf);
  local_80 = local_40 * 2 - uVar11;
  local_48 = uVar20;
  if (uVar20 != 0) {
    local_48 = 0x10 - uVar20;
  }
  local_68 = (__m128i *)(pbVar2 + local_48 + 1);
  local_50 = local_68;
  if (uVar20 != 0) {
    pbVar1 = (byte *)((long)puVar14 + uVar11 + 1);
    pbVar13 = pbVar2 + (0x10 - uVar20);
    if (pbVar2 + (0x10 - uVar20) <= pbVar1) {
      pbVar13 = pbVar1;
    }
    memset((void *)(local_40 + 0xd + (long)local_78),0,(long)pbVar13 - (long)pbVar2);
  }
  puVar14 = local_60;
  iVar7 = (int)local_80;
  local_58 = (__m128i *)in;
  if (1 < iVar7) {
    uVar20 = 0;
    do {
      bVar3 = *(byte *)((long)puVar14 + (uVar20 >> 1));
      bVar5 = bVar3 >> 4;
      if ((uVar20 & 1) == 0) {
        bVar5 = bVar3 & 0xf;
      }
      local_81 = (&SIMDGroupSimple<false,false>::tableNum)[bVar5];
      comprCompleteBlock(&local_81,&local_58,&local_68);
      uVar20 = uVar20 + 1;
    } while (iVar7 - 1 != uVar20);
  }
  iVar7 = (int)local_68;
  if (bVar18 != 0) {
    alVar40 = *local_58;
    if (bVar18 != 1) {
      iVar15 = 1;
      lVar12 = (uVar10 & 0xff) - 1;
      do {
        local_58 = local_58 + 1;
        uVar16 = iVar15 * (uint)(0x20 / bVar18);
        iVar15 = iVar15 + 1;
        lVar12 = lVar12 + -1;
        auVar4 = vpslld_avx((undefined1  [16])*local_58,ZEXT416(uVar16));
        alVar40 = (__m128i)vpor_avx((undefined1  [16])alVar40,auVar4);
      } while (lVar12 != 0);
    }
    *local_68 = alVar40;
    iVar7 = iVar7 + 0x10;
  }
  *local_78 = (uint32_t)local_70;
  local_78[1] = (uint32_t)local_80;
  local_78[2] = (uint32_t)local_40;
  *local_38 = (ulong)((((int)local_48 + (uint32_t)local_40) - (int)local_50) + 0x10 + iVar7 >> 2);
  return;
}

Assistant:

inline static void encodeArrayInternal_woRingBuf(const uint32_t *in,
                                                         const size_t len,
                                                         uint32_t *out,
                                                         size_t &nvalue) {
            // The start of the header.
            uint32_t *const outHeader32 = out;
            // The start of the selectors area.
            uint8_t *outSelArea8 =
                    reinterpret_cast<uint8_t *>(outHeader32 + countHeader32);
            uint8_t *const initOutSelArea8 = outSelArea8;

            // The number of input quads, i.e., groups of four integers. Note that we
            // assume the number of input integers to be a multiple of four.
            const size_t countIn128 = len * sizeof(uint32_t) / sizeof(__m128i);

            // Step 1: Generation of the quad max array
            // ========================================
            uint32_t *quadMaxArray = new uint32_t[countIn128];
            for (size_t i = 0; i < len; i += 4) {
                const uint32_t pseudoQuadMax = in[i] | in[i + 1] | in[i + 2] | in[i + 3];
                quadMaxArray[i >> 2] = pseudoQuadMax;
            }

            // Step 2: Pattern selection algorithm
            // ===================================
            // As described in the paper.
            size_t l = countIn128;
            size_t j = 0;
            size_t pos = 0;
            // Whether we have an even number of selectors so far.
            bool even = true;
            while (l > 0) {
                uint8_t i;
                for (i = 0; i <= 9; i++) {
                    const uint8_t n = tableNum[i];
                    // Unlike the original pattern selection algorithm, we look up the mask
                    // directly instead of calculating it from a looked up bit width.
                    const uint32_t mask = tableMask[i];
                    pos = 0;
                    const size_t maxPos = std::min(static_cast<size_t>(n), l);
                    while (pos < maxPos && quadMaxArray[j + pos] <= mask)
                        pos++;
                    if (pos == maxPos)
                        break;
                }
                l -= pos;
                j += pos;
                // Store the selector.
                if (even)
                    *outSelArea8 = i;
                else
                    *outSelArea8++ |= (i << 4);
                even = !even;
            }
            if (!even)
                // The last used byte in the selectors area was touched, but not finished.
                outSelArea8++;
            // The number of quads in the last block.
            const uint8_t countQuadsLastBlock = static_cast<uint8_t>(pos);
            *outSelArea8 = countQuadsLastBlock;

            delete[] quadMaxArray;

            // The number of bytes actually used for the selectors area.
            const size_t countSelArea8Used = outSelArea8 - initOutSelArea8;
            // The total number of selectors.
            const int countSels = int(countSelArea8Used * 2 - (even ? 0 : 1));

            // The number of bytes that could be required for the selectors area in the
            // worst case.
            const size_t countSelArea8WorstCase = countIn128 / 2 + (countIn128 & 1);

            // Depending on whether we want to leave the "pessimistic gap" between the
            // selectors area and the data area, we either reserve the true or the
            // worst-case number of bytes for the selectors area. Note that this has no
            // effect on the amount of data that we actually have to write.
            const size_t countSelArea8 =
                    pessimisticGap ? countSelArea8WorstCase : countSelArea8Used;

            const size_t countPadBytes = getCountPadBytes(countSelArea8);
            // The start of the data area.
            __m128i *outDataArea128 = reinterpret_cast<__m128i *>(initOutSelArea8 +
                                                                  countSelArea8 + sizeof(uint8_t) + countPadBytes);
            const __m128i *const initOutDataArea128 = outDataArea128;
            uint8_t *pad8 = (uint8_t *) outDataArea128 - countPadBytes;
            while (pad8 < (uint8_t *) outDataArea128)
                *pad8++ = 0; // clear padding bytes

            const __m128i *in128 = reinterpret_cast<const __m128i *>(in);

            // Step 3: Packing the uncompressed integers
            // =========================================
            // Iterate over the selectors obtained from the pattern selection algorithm
            // and compress the blocks accordingly. The last block is always treated
            // specially, since it might not be "full".
            for (int m = 0; m < countSels - 1; m++) {
                const uint8_t i = extractSel(initOutSelArea8, m);
                const size_t n = tableNum[i];
                comprCompleteBlock(uint8_t(n), in128, outDataArea128);
            }
            if (countQuadsLastBlock)
                comprIncompleteBlock(countQuadsLastBlock, in128, outDataArea128);

            // Write some meta data to the header.
            outHeader32[0] = uint32_t(len);
            outHeader32[1] = uint32_t(countSels);
            outHeader32[2] = uint32_t(countSelArea8);

            // The position of the last byte written to the output relative to the
            // start of the output. Note that the actual number of written bytes might
            // be slightly lower due to the inserted padding. However, it might even be
            // significantly lower, if pessimisticGap is true.
            const size_t nbytes = countHeader32 * sizeof(uint32_t) +
                                  countSelArea8 + sizeof(uint8_t) + countPadBytes +
                                  (outDataArea128 - initOutDataArea128) * sizeof(__m128i);
            // Rounding the number of bytes to full 32-bit integers.
            nvalue = div_roundup(uint32_t(nbytes), sizeof(uint32_t));
        }